

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathFloorFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int code;
  xmlXPathObjectPtr pxVar1;
  double dVar2;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      code = 0x17;
    }
    else {
      pxVar1 = ctxt->value;
      if (pxVar1 != (xmlXPathObjectPtr)0x0) {
        if (pxVar1->type == XPATH_NUMBER) {
LAB_001c0665:
          dVar2 = floor(pxVar1->floatval);
          pxVar1->floatval = dVar2;
          return;
        }
        xmlXPathNumberFunction(ctxt,1);
        pxVar1 = ctxt->value;
        if ((pxVar1 != (xmlXPathObjectPtr)0x0) && (pxVar1->type == XPATH_NUMBER)) goto LAB_001c0665;
      }
      code = 0xb;
    }
  }
  else {
    code = 0xc;
  }
  xmlXPathErr(ctxt,code);
  return;
}

Assistant:

void
xmlXPathFloorFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(1);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);

    ctxt->value->floatval = floor(ctxt->value->floatval);
}